

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::java::FileGenerator::Validate(FileGenerator *this,string *error)

{
  ClassNameResolver *pCVar1;
  FileDescriptor *pFVar2;
  string *dest;
  bool bVar3;
  byte bVar4;
  FileOptions_OptimizeMode FVar5;
  Edition EVar6;
  FileOptions *pFVar7;
  LogMessage *pLVar8;
  AlphaNum *in_R9;
  AlphaNum local_1d8;
  string **local_1a8;
  string **local_1a0;
  LogMessage local_190;
  Voidify local_179;
  string **local_178;
  string_view local_170;
  LogMessage local_148;
  Voidify local_131;
  string_view local_130;
  AlphaNum local_120;
  AlphaNum local_f0;
  AlphaNum local_c0;
  string_view local_90;
  AlphaNum local_80;
  string local_50;
  string_view local_30;
  string *local_20;
  string *error_local;
  FileGenerator *this_local;
  
  pCVar1 = this->name_resolver_;
  pFVar2 = this->file_;
  local_20 = error;
  error_local = (string *)this;
  local_30 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)&this->classname_);
  bVar3 = ClassNameResolver::HasConflictingClassName(pCVar1,pFVar2,local_30,EXACT_EQUAL);
  if (bVar3) {
    local_90 = FileDescriptor::name(this->file_);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_80,local_90);
    absl::lts_20250127::AlphaNum::AlphaNum
              (&local_c0,": Cannot generate Java output because the file\'s outer class name, \"");
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_f0,&this->classname_);
    absl::lts_20250127::AlphaNum::AlphaNum
              (&local_120,
               "\", matches the name of one of the types declared inside it.  Please either rename the type or use the java_outer_classname option to specify a different outer class name for the .proto file."
              );
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_50,(lts_20250127 *)&local_80,&local_c0,&local_f0,&local_120,in_R9);
    std::__cxx11::string::operator=((string *)local_20,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    this_local._7_1_ = false;
  }
  else {
    pCVar1 = this->name_resolver_;
    pFVar2 = this->file_;
    local_130 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view
                          ((string *)&this->classname_);
    bVar3 = ClassNameResolver::HasConflictingClassName(pCVar1,pFVar2,local_130,EQUAL_IGNORE_CASE);
    if (bVar3) {
      absl::lts_20250127::log_internal::LogMessage::LogMessage
                (&local_148,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/file.cc"
                 ,0xe2);
      pLVar8 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_148);
      local_170 = FileDescriptor::name(this->file_);
      pLVar8 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar8,local_170);
      pLVar8 = absl::lts_20250127::log_internal::LogMessage::operator<<
                         (pLVar8,(char (*) [33])": The file\'s outer class name, \"");
      pLVar8 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar8,&this->classname_);
      pLVar8 = absl::lts_20250127::log_internal::LogMessage::operator<<
                         (pLVar8,(char (*) [65])
                                 "\", matches the name of one of the types declared inside it when "
                         );
      pLVar8 = absl::lts_20250127::log_internal::LogMessage::operator<<
                         (pLVar8,(char (*) [65])
                                 "case is ignored. This can cause compilation issues on Windows / ")
      ;
      pLVar8 = absl::lts_20250127::log_internal::LogMessage::operator<<
                         (pLVar8,(char (*) [49])"MacOS. Please either rename the type or use the ");
      pLVar8 = absl::lts_20250127::log_internal::LogMessage::operator<<
                         (pLVar8,(char (*) [64])
                                 "java_outer_classname option to specify a different outer class ");
      pLVar8 = absl::lts_20250127::log_internal::LogMessage::operator<<
                         (pLVar8,(char (*) [37])"name for the .proto file to be safe.");
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_131,pLVar8);
      absl::lts_20250127::log_internal::LogMessage::~LogMessage(&local_148);
    }
    local_178 = &local_20;
    protobuf::internal::
    VisitDescriptors<google::protobuf::compiler::java::FileGenerator::Validate(std::__cxx11::string*)::__0>
              (this->file_,(anon_class_8_1_a7dec128)local_178);
    pFVar7 = FileDescriptor::options(this->file_);
    FVar5 = FileOptions::optimize_for(pFVar7);
    if ((FVar5 == FileOptions_OptimizeMode_LITE_RUNTIME) &&
       (((this->options_).enforce_lite & 1U) == 0)) {
      absl::lts_20250127::log_internal::LogMessage::LogMessage
                (&local_190,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/file.cc"
                 ,0xf9);
      pLVar8 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_190);
      pLVar8 = absl::lts_20250127::log_internal::LogMessage::operator<<
                         (pLVar8,(char (*) [66])
                                 "The optimize_for = LITE_RUNTIME option is no longer supported by "
                         );
      pLVar8 = absl::lts_20250127::log_internal::LogMessage::operator<<
                         (pLVar8,(char (*) [65])
                                 "protobuf Java code generator and is ignored--protoc will always ")
      ;
      pLVar8 = absl::lts_20250127::log_internal::LogMessage::operator<<
                         (pLVar8,(char (*) [64])
                                 "generate full runtime code for Java. To use Java Lite runtime, ");
      pLVar8 = absl::lts_20250127::log_internal::LogMessage::operator<<
                         (pLVar8,(char (*) [53])
                                 "users should use the Java Lite plugin instead. See:\n");
      pLVar8 = absl::lts_20250127::log_internal::LogMessage::operator<<
                         (pLVar8,(char (*) [69])
                                 "  https://github.com/protocolbuffers/protobuf/blob/main/java/lite.md"
                         );
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_179,pLVar8);
      absl::lts_20250127::log_internal::LogMessage::~LogMessage(&local_190);
    }
    local_1a0 = &local_20;
    protobuf::internal::
    VisitDescriptors<google::protobuf::compiler::java::FileGenerator::Validate(std::__cxx11::string*)::__1>
              (this->file_,(anon_class_8_1_a7dec128)local_1a0);
    local_1a8 = &local_20;
    protobuf::internal::
    VisitDescriptors<google::protobuf::compiler::java::FileGenerator::Validate(std::__cxx11::string*)::__2>
              (this->file_,(anon_class_8_1_a7dec128)local_1a8);
    EVar6 = CodeGenerator::GetEdition(this->file_);
    if (1000 < (int)EVar6) {
      pFVar7 = FileDescriptor::options(this->file_);
      bVar3 = FileOptions::has_java_multiple_files(pFVar7);
      dest = local_20;
      if (bVar3) {
        absl::lts_20250127::AlphaNum::AlphaNum
                  (&local_1d8,
                   "The file option `java_multiple_files` is not supported in editions 2024 and above, which defaults to the feature value of `nest_in_file_class = NO` (equivalent to `java_multiple_files = true`)."
                  );
        absl::lts_20250127::StrAppend(dest,&local_1d8);
      }
    }
    bVar4 = std::__cxx11::string::empty();
    this_local._7_1_ = (bool)(bVar4 & 1);
  }
  return this_local._7_1_;
}

Assistant:

bool FileGenerator::Validate(std::string* error) {
  // Check that no class name matches the file's class name.  This is a common
  // problem that leads to Java compile errors that can be hard to understand.
  // It's especially bad when using the java_multiple_files, since we would
  // end up overwriting the outer class with one of the inner ones.
  if (name_resolver_->HasConflictingClassName(file_, classname_,
                                              NameEquality::EXACT_EQUAL)) {
    *error = absl::StrCat(
        file_->name(),
        ": Cannot generate Java output because the file's outer class name, "
        "\"",
        classname_,
        "\", matches the name of one of the types declared inside it.  "
        "Please either rename the type or use the java_outer_classname "
        "option to specify a different outer class name for the .proto file.");
    return false;
  }
  // Similar to the check above, but ignore the case this time. This is not a
  // problem on Linux, but will lead to Java compile errors on Windows / Mac
  // because filenames are case-insensitive on those platforms.
  if (name_resolver_->HasConflictingClassName(
          file_, classname_, NameEquality::EQUAL_IGNORE_CASE)) {
    ABSL_LOG(WARNING)
        << file_->name() << ": The file's outer class name, \"" << classname_
        << "\", matches the name of one of the types declared inside it when "
        << "case is ignored. This can cause compilation issues on Windows / "
        << "MacOS. Please either rename the type or use the "
        << "java_outer_classname option to specify a different outer class "
        << "name for the .proto file to be safe.";
  }

  // Check that no field is a closed enum with implicit presence. For normal
  // cases this will be rejected by protoc before the generator is invoked, but
  // for cases like legacy_closed_enum it may reach the generator.
  google::protobuf::internal::VisitDescriptors(*file_, [&](const FieldDescriptor& field) {
    if (field.enum_type() != nullptr && !SupportUnknownEnumValue(&field) &&
        !field.has_presence() && !field.is_repeated()) {
      absl::StrAppend(error, "Field ", field.full_name(),
                      " has a closed enum type with implicit presence.\n");
    }
  });

  // Print a warning if optimize_for = LITE_RUNTIME is used.
  if (file_->options().optimize_for() == FileOptions::LITE_RUNTIME &&
      !options_.enforce_lite) {
    ABSL_LOG(WARNING)
        << "The optimize_for = LITE_RUNTIME option is no longer supported by "
        << "protobuf Java code generator and is ignored--protoc will always "
        << "generate full runtime code for Java. To use Java Lite runtime, "
        << "users should use the Java Lite plugin instead. See:\n"
        << "  "
           "https://github.com/protocolbuffers/protobuf/blob/main/java/"
           "lite.md";
  }
  google::protobuf::internal::VisitDescriptors(*file_, [&](const EnumDescriptor& enm) {
    if (CheckLargeEnum(&enm) && enm.is_closed()) {
      absl::StrAppend(
          error, enm.full_name(),
          " is a closed enum and can not be used with the large_enum feature.  "
          "Please migrate to an open enum first, which is a better fit for "
          "extremely large enums.\n");
    }
    absl::Status status = ValidateNestInFileClassFeature(enm);
    if (!status.ok()) {
      absl::StrAppend(error, status.message());
    }
  });

  google::protobuf::internal::VisitDescriptors(*file_, [&](const Descriptor& message) {
    absl::Status status = ValidateNestInFileClassFeature(message);
    if (!status.ok()) {
      absl::StrAppend(error, status.message());
    }
  });

  if (JavaGenerator::GetEdition(*file_) >= Edition::EDITION_2024) {
    if (file_->options().has_java_multiple_files()) {
      absl::StrAppend(
          error,
          "The file option `java_multiple_files` is not supported in "
          "editions 2024 and above, which defaults to the feature value of"
          " `nest_in_file_class = NO` (equivalent to "
          "`java_multiple_files = true`).");
    }
  }

  return error->empty();
}